

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O0

ssize_t __thiscall
anon_unknown.dwarf_f3d98::MMIFStream::read(MMIFStream *this,int __fd,void *__buf,size_t __nbytes)

{
  InputExc *this_00;
  undefined4 in_register_00000034;
  bool retVal;
  uint64_t n2;
  bool local_31;
  size_t local_30;
  
  if ((this->_length <= this->_pos) && ((int)__buf != 0)) {
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc(this_00,"Unexpected end of file.");
    __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
  }
  local_30 = (size_t)(int)__buf;
  local_31 = this->_length - this->_pos <= local_30;
  if (local_31) {
    local_30 = this->_length - this->_pos;
  }
  local_31 = !local_31;
  memcpy((void *)CONCAT44(in_register_00000034,__fd),this->_mmapStart + this->_pos,local_30);
  this->_pos = local_30 + this->_pos;
  return CONCAT71((int7)((ulong)this >> 8),local_31);
}

Assistant:

bool
MMIFStream::read (char c[/*n*/], int n)
{
    if (_pos >= _length && n != 0)
        throw IEX_NAMESPACE::InputExc ("Unexpected end of file.");

    uint64_t n2     = n;
    bool     retVal = true;

    if (_length - _pos <= n2)
    {
        n2     = _length - _pos;
        retVal = false;
    }

    memcpy (c, _mmapStart + _pos, n2);
    _pos += n2;
    return retVal;
}